

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_table_entry.cpp
# Opt level: O3

DroppedFieldMapping *
duckdb::DropFieldFromStruct
          (DroppedFieldMapping *__return_storage_ptr__,LogicalType *type,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *column_path,idx_t depth)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *l1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  pointer pcVar3;
  element_type *peVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> **pp_Var5;
  undefined8 uVar6;
  undefined8 uVar7;
  bool bVar8;
  undefined8 extraout_RAX;
  CatalogException *pCVar9;
  const_reference pvVar10;
  LogicalType *type_00;
  pointer ppVar11;
  child_list_t<Value> child_values;
  child_list_t<Value> child_mapping;
  child_list_t<LogicalType> new_type_children;
  Value mapping_value;
  LogicalType local_3c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *local_3a8;
  ulong local_3a0;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  local_398;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  pointer local_338;
  pointer ppStack_330;
  pointer local_328;
  idx_t local_320;
  const_reference local_318;
  Value local_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2c8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_2c0;
  LogicalType *local_2b8;
  child_list_t<LogicalType> *local_2b0;
  idx_t local_2a8;
  pointer local_2a0;
  string local_298;
  undefined1 local_278 [8];
  _Alloc_hider local_270;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_268;
  undefined1 local_260 [32];
  undefined1 local_240 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_230 [56];
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  local_1f8;
  Value local_1e0;
  undefined1 local_1a0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_180;
  size_type local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_160;
  size_type local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_140 [56];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  child_list_t<LogicalType> local_e8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  LogicalType local_48;
  
  if (type->id_ != STRUCT) {
    pCVar9 = (CatalogException *)__cxa_allocate_exception(0x10);
    local_1e0.type_._0_8_ = (long)&local_1e0 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1e0,"Cannot drop field from column \"%s\" - not a struct","");
    pvVar10 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ::operator[](column_path,0);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    pcVar3 = (pvVar10->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar3,pcVar3 + pvVar10->_M_string_length);
    CatalogException::CatalogException<std::__cxx11::string>(pCVar9,(string *)&local_1e0,&local_68);
    __cxa_throw(pCVar9,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
  }
  local_318 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ::operator[](column_path,depth);
  local_320 = (long)(column_path->
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(column_path->
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
  LogicalType::LogicalType((LogicalType *)local_278,SQLNULL);
  Value::Value(&local_1e0,(LogicalType *)local_278);
  LogicalType::~LogicalType((LogicalType *)local_278);
  LogicalType::LogicalType((LogicalType *)local_1a0);
  ErrorData::ErrorData((ErrorData *)(local_1a0 + 0x18));
  local_378.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_378.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_378.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_328 = (pointer)0x0;
  local_338 = (pointer)0x0;
  ppStack_330 = (pointer)0x0;
  local_2b0 = StructType::GetChildTypes_abi_cxx11_(type);
  ppVar11 = (local_2b0->
            super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
            ).
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_2a0 = (local_2b0->
              super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              ).
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar11 != local_2a0) {
    local_2a8 = depth + 1;
    local_320 = (long)local_320 >> 5;
    local_2b8 = &__return_storage_ptr__->new_type;
    local_2c0 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&(__return_storage_ptr__->error).extra_info;
    local_2c8 = &(__return_storage_ptr__->error).final_message.field_2;
    local_2d0 = &(__return_storage_ptr__->error).raw_message.field_2;
    local_3a0 = 0;
    type_00 = &ppVar11->second;
    local_3a8 = column_path;
    do {
      LogicalType::LogicalType(&local_48,SQLNULL);
      Value::Value((Value *)local_278,&local_48);
      LogicalType::~LogicalType(&local_48);
      LogicalType::LogicalType(&local_3c0);
      l1 = &type_00[-2].type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      bVar8 = StringUtil::CIEquals((string *)l1,(string *)local_318);
      if (bVar8) {
        if (local_2a8 != local_320) {
          DropFieldFromStruct(__return_storage_ptr__,type_00,local_3a8,local_2a8);
          if ((__return_storage_ptr__->error).initialized == false) {
            Value::operator=((Value *)local_278,&__return_storage_ptr__->mapping);
            local_3c0.id_ = (__return_storage_ptr__->new_type).id_;
            local_3c0.physical_type_ = (__return_storage_ptr__->new_type).physical_type_;
            peVar4 = (__return_storage_ptr__->new_type).type_info_.internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            p_Var2 = (__return_storage_ptr__->new_type).type_info_.internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
            (__return_storage_ptr__->new_type).type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 local_3c0.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            (__return_storage_ptr__->new_type).type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 = local_3c0.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi;
            local_3c0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
            local_3c0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 = p_Var2;
            ::std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::~_Hashtable(local_2c0);
            pcVar3 = (__return_storage_ptr__->error).final_message._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar3 != local_2c8) {
              operator_delete(pcVar3);
            }
            pcVar3 = (__return_storage_ptr__->error).raw_message._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar3 != local_2d0) {
              operator_delete(pcVar3);
            }
            LogicalType::~LogicalType(local_2b8);
            Value::~Value(&__return_storage_ptr__->mapping);
            local_3a0 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
            goto LAB_011dec27;
          }
          LogicalType::~LogicalType(&local_3c0);
          Value::~Value((Value *)local_278);
          goto LAB_011df135;
        }
        local_3a0 = CONCAT71((int7)((ulong)local_2b0 >> 8),1);
        if ((long)(local_2b0->
                  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                  ).
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(local_2b0->
                  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                  ).
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                  ._M_impl.super__Vector_impl_data._M_start == 0x38) {
          pCVar9 = (CatalogException *)__cxa_allocate_exception(0x10);
          local_310.type_._0_8_ =
               &local_310.type_.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_310,
                     "Cannot drop field %s from column %s - it is the last field of the struct","");
          pvVar10 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ::back(local_3a8);
          local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
          pcVar3 = (pvVar10->_M_dataplus)._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_88,pcVar3,pcVar3 + pvVar10->_M_string_length);
          pvVar10 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ::front(local_3a8);
          local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
          pcVar3 = (pvVar10->_M_dataplus)._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_a8,pcVar3,pcVar3 + pvVar10->_M_string_length);
          CatalogException::CatalogException<std::__cxx11::string,std::__cxx11::string>
                    (pCVar9,(string *)&local_310,&local_88,&local_a8);
          __cxa_throw(pCVar9,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
      else {
        ConstructMapping(&local_310,(string *)l1,type_00);
        Value::operator=((Value *)local_278,&local_310);
        Value::~Value(&local_310);
        if (type_00 != &local_3c0) {
          local_3c0.id_ = type_00->id_;
          local_3c0.physical_type_ = type_00->physical_type_;
          shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                    (&local_3c0.type_info_,&type_00->type_info_);
        }
LAB_011dec27:
        if (type_00->id_ == STRUCT) {
          local_398.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_398.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_398.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
          local_358._M_string_length = 0;
          local_358.field_2._M_local_buf[0] = '\0';
          local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
          p_Var2 = type_00[-2].type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_298,p_Var2,
                     (long)&p_Var2->_vptr__Sp_counted_base + *(long *)(type_00 + -1));
          Value::Value(&local_310,&local_298);
          ::std::
          vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
          ::emplace_back<std::__cxx11::string,duckdb::Value>
                    ((vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
                      *)&local_398,&local_358,&local_310);
          Value::~Value(&local_310);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298._M_dataplus._M_p != &local_298.field_2) {
            operator_delete(local_298._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_358._M_dataplus._M_p != &local_358.field_2) {
            operator_delete(local_358._M_dataplus._M_p);
          }
          pp_Var5 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)
                    &local_310.type_.type_info_.internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount;
          local_310.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_310.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _0_1_ = '\0';
          local_310.type_._0_8_ = pp_Var5;
          ::std::
          vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
          ::emplace_back<std::__cxx11::string,duckdb::Value>
                    ((vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
                      *)&local_398,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_310
                     ,(Value *)local_278);
          if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_310.type_._0_8_ != pp_Var5) {
            operator_delete((void *)local_310.type_._0_8_);
          }
          local_1f8.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               local_398.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_1f8.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_398.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_1f8.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               local_398.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_398.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_398.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_398.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          Value::STRUCT(&local_310,(child_list_t<Value> *)&local_1f8);
          Value::operator=((Value *)local_278,&local_310);
          Value::~Value(&local_310);
          ::std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
          ::~vector(&local_1f8);
          ::std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
          ::~vector(&local_398);
        }
        ::std::
        vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
        ::emplace_back<std::__cxx11::string_const&,duckdb::Value>
                  ((vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
                    *)&local_378,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)l1,
                   (Value *)local_278);
        ::std::
        vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
        ::emplace_back<std::__cxx11::string_const&,duckdb::LogicalType&>
                  ((vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
                    *)&local_338,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)l1,
                   &local_3c0);
      }
      LogicalType::~LogicalType(&local_3c0);
      Value::~Value((Value *)local_278);
      ppVar11 = (pointer)(type_00 + 1);
      type_00 = (LogicalType *)&type_00[2].type_info_;
    } while (ppVar11 != local_2a0);
    if ((local_3a0 & 1) != 0) {
      local_c8.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_378.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_c8.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_378.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_c8.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_378.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_378.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_378.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_378.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Value::STRUCT((Value *)local_278,(child_list_t<Value> *)&local_c8);
      Value::operator=(&local_1e0,(Value *)local_278);
      Value::~Value((Value *)local_278);
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ::~vector(&local_c8);
      local_e8.
      super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      .
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ._M_impl.super__Vector_impl_data._M_start = local_338;
      local_e8.
      super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      .
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppStack_330;
      local_e8.
      super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      .
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = local_328;
      local_338 = (pointer)0x0;
      ppStack_330 = (pointer)0x0;
      local_328 = (pointer)0x0;
      LogicalType::STRUCT((LogicalType *)local_278,&local_e8);
      uVar7 = local_1a0._16_8_;
      uVar6 = local_1a0._8_8_;
      local_1a0._0_2_ = local_278._0_2_;
      local_1a0._8_8_ = local_270._M_p;
      local_1a0._16_8_ = _Stack_268._M_pi;
      local_270._M_p = (pointer)uVar6;
      _Stack_268._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7;
      LogicalType::~LogicalType((LogicalType *)local_278);
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                 *)&local_e8);
      goto LAB_011df033;
    }
  }
  pp_Var5 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)
            &local_310.type_.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  local_310.type_._0_8_ = pp_Var5;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_310,"Cannot drop field \"%s\" - it does not exist","");
  pcVar3 = (local_318->_M_dataplus)._M_p;
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_108,pcVar3,pcVar3 + local_318->_M_string_length);
  CatalogException::CatalogException<std::__cxx11::string>
            ((CatalogException *)&local_358,(string *)&local_310,&local_108);
  ErrorData::ErrorData((ErrorData *)local_278,(exception *)&local_358);
  local_1a0._24_2_ = local_278._0_2_;
  ::std::__cxx11::string::operator=((string *)&local_180,(string *)&local_270);
  ::std::__cxx11::string::operator=((string *)&local_160,(string *)(local_260 + 0x10));
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_M_move_assign(local_140,local_230);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(local_230);
  if ((undefined1 *)local_260._16_8_ != local_240) {
    operator_delete((void *)local_260._16_8_);
  }
  if ((element_type *)local_270._M_p != (element_type *)local_260) {
    operator_delete(local_270._M_p);
  }
  ::std::runtime_error::~runtime_error((runtime_error *)&local_358);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_310.type_._0_8_ != pp_Var5) {
    operator_delete((void *)local_310.type_._0_8_);
  }
LAB_011df033:
  Value::Value(&__return_storage_ptr__->mapping,&local_1e0);
  LogicalType::LogicalType(&__return_storage_ptr__->new_type,(LogicalType *)local_1a0);
  (__return_storage_ptr__->error).initialized = (bool)local_1a0[0x18];
  (__return_storage_ptr__->error).type = local_1a0[0x19];
  paVar1 = &(__return_storage_ptr__->error).raw_message.field_2;
  (__return_storage_ptr__->error).raw_message._M_dataplus._M_p = (pointer)paVar1;
  if (local_180 == &local_170) {
    *(undefined4 *)paVar1 = local_170._M_allocated_capacity._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->error).raw_message.field_2 + 4) =
         local_170._M_allocated_capacity._4_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->error).raw_message.field_2 + 8) =
         local_170._8_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->error).raw_message.field_2 + 0xc) =
         local_170._12_4_;
  }
  else {
    (__return_storage_ptr__->error).raw_message._M_dataplus._M_p = (pointer)local_180;
    (__return_storage_ptr__->error).raw_message.field_2._M_allocated_capacity =
         CONCAT44(local_170._M_allocated_capacity._4_4_,local_170._M_allocated_capacity._0_4_);
  }
  (__return_storage_ptr__->error).raw_message._M_string_length = local_178;
  local_178 = 0;
  local_170._M_allocated_capacity._0_4_ = local_170._M_allocated_capacity._0_4_ & 0xffffff00;
  paVar1 = &(__return_storage_ptr__->error).final_message.field_2;
  (__return_storage_ptr__->error).final_message._M_dataplus._M_p = (pointer)paVar1;
  if (local_160 == &local_150) {
    *(undefined4 *)paVar1 = local_150._M_allocated_capacity._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->error).final_message.field_2 + 4) =
         local_150._M_allocated_capacity._4_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->error).final_message.field_2 + 8) =
         local_150._8_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->error).final_message.field_2 + 0xc) =
         local_150._12_4_;
  }
  else {
    (__return_storage_ptr__->error).final_message._M_dataplus._M_p = (pointer)local_160;
    (__return_storage_ptr__->error).final_message.field_2._M_allocated_capacity =
         CONCAT44(local_150._M_allocated_capacity._4_4_,local_150._M_allocated_capacity._0_4_);
  }
  (__return_storage_ptr__->error).final_message._M_string_length = local_158;
  local_158 = 0;
  local_150._M_allocated_capacity._0_4_ = local_150._M_allocated_capacity._0_4_ & 0xffffff00;
  local_180 = &local_170;
  local_160 = &local_150;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)&(__return_storage_ptr__->error).extra_info,local_140,local_140);
LAB_011df135:
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             *)&local_338);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ::~vector(&local_378);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(local_140);
  if (local_160 != &local_150) {
    operator_delete(local_160);
  }
  if (local_180 != &local_170) {
    operator_delete(local_180);
  }
  LogicalType::~LogicalType((LogicalType *)local_1a0);
  Value::~Value(&local_1e0);
  return __return_storage_ptr__;
}

Assistant:

DroppedFieldMapping DropFieldFromStruct(const LogicalType &type, const vector<string> &column_path, idx_t depth) {
	if (type.id() != LogicalTypeId::STRUCT) {
		throw CatalogException("Cannot drop field from column \"%s\" - not a struct", column_path[0]);
	}
	auto &dropped_entry = column_path[depth];
	bool last_entry = depth + 1 == column_path.size();
	bool found = false;
	DroppedFieldMapping result;
	child_list_t<Value> child_mapping;
	child_list_t<LogicalType> new_type_children;
	auto &child_types = StructType::GetChildTypes(type);
	for (auto &entry : child_types) {
		Value mapping_value;
		LogicalType type_value;
		if (StringUtil::CIEquals(entry.first, dropped_entry)) {
			// this is the entry we are dropping
			found = true;
			if (last_entry) {
				// we are dropping this entry in its entirety - just skip
				if (child_types.size() == 1) {
					throw CatalogException("Cannot drop field %s from column %s - it is the last field of the struct",
					                       column_path.back(), column_path.front());
				}
				continue;
			} else {
				// we are dropping a field in this entry - recurse
				auto child_result = DropFieldFromStruct(entry.second, column_path, depth + 1);
				if (child_result.error.HasError()) {
					// bubble up error
					return child_result;
				}
				mapping_value = std::move(child_result.mapping);
				type_value = std::move(child_result.new_type);
			}
		} else {
			// we are not adjusting this entry - copy the type and create a straightforward mapping
			mapping_value = ConstructMapping(entry.first, entry.second);
			type_value = entry.second;
		}
		if (entry.second.id() == LogicalTypeId::STRUCT) {
			child_list_t<Value> child_values;
			child_values.emplace_back(string(), Value(entry.first));
			child_values.emplace_back(string(), std::move(mapping_value));
			mapping_value = Value::STRUCT(std::move(child_values));
		}
		child_mapping.emplace_back(entry.first, std::move(mapping_value));
		new_type_children.emplace_back(entry.first, type_value);
	}
	if (!found) {
		result.error = ErrorData(CatalogException("Cannot drop field \"%s\" - it does not exist", dropped_entry));
	} else {
		result.mapping = Value::STRUCT(std::move(child_mapping));
		result.new_type = LogicalType::STRUCT(std::move(new_type_children));
	}
	return result;
}